

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::ZeroCopyInputStream::ReadCord(ZeroCopyInputStream *this,Cord *cord,int count)

{
  anon_union_16_2_b9f6da03_for_Rep_1 *buffer_00;
  byte bVar1;
  ulong *puVar2;
  undefined8 uVar3;
  int iVar4;
  ulong uVar5;
  CordRepFlat *pCVar6;
  undefined8 extraout_RAX;
  sbyte sVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  pointer pcVar11;
  void *__src;
  bool bVar12;
  Span<char> SVar13;
  CordBuffer cord_buffer;
  int size;
  void *buffer;
  anon_class_24_3_65f58981 AppendFullBuffer;
  int local_a4;
  anon_union_16_2_39e9c77e_for_Rep_0 local_a0;
  Cord *local_90;
  int local_84;
  ZeroCopyInputStream *local_80;
  anon_union_16_2_b9f6da03_for_Rep_1 local_78;
  anon_union_16_2_b9f6da03_for_Rep_1 local_68;
  void *local_50;
  anon_class_24_3_65f58981 local_48;
  
  if (count < 1) {
    return true;
  }
  uVar9 = (ulong)(uint)count;
  uVar5 = (ulong)(cord->contents_).data_.rep_.field_0.data[0];
  if ((uVar5 & 1) == 0) {
    uVar5 = uVar5 >> 1;
  }
  else {
    uVar5 = ((cord->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  local_a4 = count;
  local_90 = cord;
  local_80 = this;
  if (uVar5 == 0) {
    if (0xf < (uint)count) {
      pCVar6 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(uVar9);
      (pCVar6->super_CordRep).length = 0;
      local_a0.data[0] = (char)pCVar6;
      local_a0.as_tree.cordz_info._1_7_ = (undefined7)((ulong)pCVar6 >> 8);
      goto LAB_00228f7f;
    }
    local_a0.data[0] = 1;
    local_a0.as_tree.cordz_info._1_7_ = 0;
    local_a0.data[8] = '\0';
    local_a0._9_7_ = 0;
  }
  else {
    absl::lts_20250127::Cord::GetAppendBufferSlowPath
              ((Cord *)&local_a0.as_tree,(size_t)cord,0,uVar9);
    pCVar6 = (CordRepFlat *)(ulong)(byte)local_a0.data[0];
    count = local_a4;
LAB_00228f7f:
    uVar9 = (ulong)count;
    if (((ulong)pCVar6 & 1) == 0) {
      SVar13 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)&local_a0.as_tree);
      goto LAB_00228fad;
    }
  }
  SVar13 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)&local_a0.as_tree);
LAB_00228fad:
  pcVar11 = SVar13.ptr_;
  if (SVar13.len_ < uVar9) {
    uVar9 = SVar13.len_;
  }
  local_48.cord = &local_90;
  local_48.cord_buffer = (CordBuffer *)&local_a0;
  local_48.count = &local_a4;
  do {
    SVar13.len_ = uVar9;
    SVar13.ptr_ = pcVar11;
    iVar4 = (*local_80->_vptr_ZeroCopyInputStream[2])(local_80,&local_50,&local_84);
    if ((char)iVar4 == '\0') {
LAB_002291f5:
      local_68.long_rep.rep =
           (CordRepFlat *)CONCAT71(local_a0.as_tree.cordz_info._1_7_,local_a0.data[0]);
      local_68.long_rep.padding = (void *)CONCAT71(local_a0._9_7_,local_a0.data[8]);
      buffer_00 = &local_68;
      local_a0.data[0] = 1;
      absl::lts_20250127::Cord::Append(local_90,(CordBuffer *)&buffer_00->long_rep);
      bVar12 = false;
      bVar10 = false;
      uVar3 = local_68.long_rep.rep;
      goto joined_r0x00229221;
    }
    iVar4 = local_84;
    if (local_a4 < local_84) {
      (*local_80->_vptr_ZeroCopyInputStream[3])();
      iVar4 = local_a4;
    }
    __src = local_50;
    if (iVar4 == 0) goto LAB_002291f5;
    if (uVar9 == 0) {
      SVar13 = ReadCord::anon_class_24_3_65f58981::operator()(&local_48);
    }
    uVar9 = (ulong)iVar4;
    if (SVar13.len_ < uVar9) {
      do {
        uVar5 = SVar13.len_;
        memcpy(SVar13.ptr_,__src,uVar5);
        local_a4 = local_a4 - (int)SVar13.len_;
        if ((local_a0.data[0] & 1U) == 0) {
          puVar2 = (ulong *)CONCAT71(local_a0.as_tree.cordz_info._1_7_,local_a0.data[0]);
          bVar1 = *(byte *)((long)puVar2 + 0xc);
          sVar7 = 0xc;
          if (bVar1 < 0xbb) {
            sVar7 = 6;
          }
          iVar4 = -0xb800d;
          if (bVar1 < 0xbb) {
            iVar4 = -0xe8d;
          }
          if (bVar1 < 0x43) {
            sVar7 = 3;
            iVar4 = -0x1d;
          }
          uVar8 = (ulong)(int)(((uint)bVar1 << sVar7) + iVar4);
          if ((uVar8 < uVar5) || (uVar8 < *puVar2 + uVar5)) {
LAB_00229250:
            ReadCord();
            goto LAB_00229255;
          }
          *puVar2 = *puVar2 + uVar5;
        }
        else {
          if ((0xf < uVar5) || (0xf < (long)(local_a0.data[0] >> 1) + uVar5)) goto LAB_00229250;
          local_a0.data[0] = local_a0.data[0] + (char)SVar13.len_ * '\x02';
        }
        SVar13 = ReadCord::anon_class_24_3_65f58981::operator()(&local_48);
        __src = (void *)((long)__src + uVar5);
        uVar9 = uVar9 - uVar5;
      } while (SVar13.len_ < uVar9);
    }
    memcpy(SVar13.ptr_,__src,uVar9);
    local_a4 = local_a4 - (int)uVar9;
    if ((local_a0.data[0] & 1U) == 0) {
      puVar2 = (ulong *)CONCAT71(local_a0.as_tree.cordz_info._1_7_,local_a0.data[0]);
      bVar1 = *(byte *)((long)puVar2 + 0xc);
      sVar7 = 0xc;
      if (bVar1 < 0xbb) {
        sVar7 = 6;
      }
      iVar4 = -0xb800d;
      if (bVar1 < 0xbb) {
        iVar4 = -0xe8d;
      }
      if (bVar1 < 0x43) {
        sVar7 = 3;
        iVar4 = -0x1d;
      }
      uVar5 = (ulong)(int)(((uint)bVar1 << sVar7) + iVar4);
      if ((uVar5 < uVar9) || (uVar5 < *puVar2 + uVar9)) {
LAB_00229255:
        ReadCord();
        if (((ulong)local_78.long_rep.rep & 1) == 0) {
          absl::lts_20250127::cord_internal::CordRepFlat::Delete
                    (&(local_78.long_rep.rep)->super_CordRep);
        }
        if ((local_a0.data[0] & 1U) == 0) {
          absl::lts_20250127::cord_internal::CordRepFlat::Delete
                    ((CordRep *)CONCAT71(local_a0.as_tree.cordz_info._1_7_,local_a0.data[0]));
        }
        _Unwind_Resume(extraout_RAX);
      }
      *puVar2 = *puVar2 + uVar9;
    }
    else {
      if ((0xf < uVar9) || (0xf < (long)(local_a0.data[0] >> 1) + uVar9)) goto LAB_00229255;
      local_a0.data[0] = local_a0.data[0] + (char)uVar9 * '\x02';
    }
    pcVar11 = SVar13.ptr_ + uVar9;
    uVar9 = SVar13.len_ - uVar9;
  } while (0 < local_a4);
  local_78.long_rep.rep =
       (CordRepFlat *)CONCAT71(local_a0.as_tree.cordz_info._1_7_,local_a0.data[0]);
  local_78.long_rep.padding = (void *)CONCAT71(local_a0._9_7_,local_a0.data[8]);
  buffer_00 = &local_78;
  local_a0.data[0] = 1;
  absl::lts_20250127::Cord::Append(local_90,(CordBuffer *)&buffer_00->long_rep);
  bVar12 = true;
  bVar10 = true;
  uVar3 = local_78.long_rep.rep;
joined_r0x00229221:
  if ((uVar3 & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              (&((((Rep *)&(buffer_00->long_rep).rep)->field_0).long_rep.rep)->super_CordRep);
    bVar10 = bVar12;
  }
  if ((local_a0.data[0] & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_a0.as_tree.cordz_info._1_7_,local_a0.data[0]));
  }
  return bVar10;
}

Assistant:

bool ZeroCopyInputStream::ReadCord(absl::Cord* cord, int count) {
  if (count <= 0) return true;

  absl::CordBuffer cord_buffer = cord->GetAppendBuffer(count);
  absl::Span<char> out = cord_buffer.available_up_to(count);

  auto FetchNextChunk = [&]() -> absl::Span<const char> {
    const void* buffer;
    int size;
    if (!Next(&buffer, &size)) return {};

    if (size > count) {
      BackUp(size - count);
      size = count;
    }
    return absl::MakeConstSpan(static_cast<const char*>(buffer), size);
  };

  auto AppendFullBuffer = [&]() -> absl::Span<char> {
    cord->Append(std::move(cord_buffer));
    cord_buffer = absl::CordBuffer::CreateWithDefaultLimit(count);
    return cord_buffer.available_up_to(count);
  };

  auto CopyBytes = [&](absl::Span<char>& dst, absl::Span<const char>& src,
                       size_t bytes) {
    memcpy(dst.data(), src.data(), bytes);
    dst.remove_prefix(bytes);
    src.remove_prefix(bytes);
    count -= bytes;
    cord_buffer.IncreaseLengthBy(bytes);
  };

  do {
    absl::Span<const char> in = FetchNextChunk();
    if (in.empty()) {
      // Append whatever we have pending so far.
      cord->Append(std::move(cord_buffer));
      return false;
    }

    if (out.empty()) out = AppendFullBuffer();

    while (in.size() > out.size()) {
      CopyBytes(out, in, out.size());
      out = AppendFullBuffer();
    }

    CopyBytes(out, in, in.size());
  } while (count > 0);

  cord->Append(std::move(cord_buffer));
  return true;
}